

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

Vec3 __thiscall rr::advblend::setLumSat(advblend *this,Vec3 *cbase,Vec3 *csat,Vec3 *clum)

{
  uint uVar1;
  float s;
  float s_00;
  float fVar2;
  Vec3 VVar3;
  Vec3 color;
  Vector<float,_3> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  tcu local_44 [12];
  tcu local_38 [12];
  tcu local_2c [8];
  float local_24;
  
  local_68 = ZEXT416((uint)cbase->m_data[0]);
  local_78 = ZEXT416((uint)cbase->m_data[1]);
  local_58 = ZEXT416((uint)cbase->m_data[2]);
  s = saturation(cbase);
  s_00 = saturation(csat);
  tcu::Vector<float,_3>::Vector(&local_88,0.0);
  if (0.0 < s) {
    fVar2 = (float)(~-(uint)((float)local_68._0_4_ <= (float)local_78._0_4_) & local_78._0_4_ |
                   local_68._0_4_ & -(uint)((float)local_68._0_4_ <= (float)local_78._0_4_));
    uVar1 = -(uint)(fVar2 <= (float)local_58._0_4_);
    tcu::operator-(local_44,cbase,(float)(~uVar1 & local_58._0_4_ | uVar1 & (uint)fVar2));
    tcu::operator*(local_38,s_00,(Vector<float,_3> *)local_44);
    tcu::operator/(local_2c,(Vector<float,_3> *)local_38,s);
    local_88.m_data[2] = local_24;
    local_88.m_data._0_8_ = local_2c;
  }
  VVar3 = setLum(this,&local_88,clum);
  return (Vec3)VVar3.m_data;
}

Assistant:

Vec3 setLumSat (const Vec3& cbase, const Vec3& csat, const Vec3& clum)
{
	const float		minbase	= minComp(cbase);
	const float		sbase	= saturation(cbase);
	const float		ssat	= saturation(csat);
	Vec3			color	= Vec3(0.0f);

	if (sbase > 0.0f)
		color = (cbase - minbase) * ssat / sbase;
	else
		color = color;

	return setLum(color, clum);
}